

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngset.c
# Opt level: O1

void png_set_cHRM(png_const_structrp png_ptr,png_inforp info_ptr,double white_x,double white_y,
                 double red_x,double red_y,double green_x,double green_y,double blue_x,double blue_y
                 )

{
  png_fixed_point white_x_00;
  png_fixed_point white_y_00;
  png_fixed_point red_x_00;
  png_fixed_point red_y_00;
  png_fixed_point green_x_00;
  png_fixed_point green_y_00;
  png_fixed_point blue_x_00;
  png_fixed_point blue_y_00;
  
  white_x_00 = png_fixed(png_ptr,white_x,"cHRM White X");
  white_y_00 = png_fixed(png_ptr,white_y,"cHRM White Y");
  red_x_00 = png_fixed(png_ptr,red_x,"cHRM Red X");
  red_y_00 = png_fixed(png_ptr,red_y,"cHRM Red Y");
  green_x_00 = png_fixed(png_ptr,green_x,"cHRM Green X");
  green_y_00 = png_fixed(png_ptr,green_y,"cHRM Green Y");
  blue_x_00 = png_fixed(png_ptr,blue_x,"cHRM Blue X");
  blue_y_00 = png_fixed(png_ptr,blue_y,"cHRM Blue Y");
  png_set_cHRM_fixed(png_ptr,info_ptr,white_x_00,white_y_00,red_x_00,red_y_00,green_x_00,green_y_00,
                     blue_x_00,blue_y_00);
  return;
}

Assistant:

void PNGAPI
png_set_cHRM(png_const_structrp png_ptr, png_inforp info_ptr,
    double white_x, double white_y, double red_x, double red_y,
    double green_x, double green_y, double blue_x, double blue_y)
{
   png_set_cHRM_fixed(png_ptr, info_ptr,
       png_fixed(png_ptr, white_x, "cHRM White X"),
       png_fixed(png_ptr, white_y, "cHRM White Y"),
       png_fixed(png_ptr, red_x, "cHRM Red X"),
       png_fixed(png_ptr, red_y, "cHRM Red Y"),
       png_fixed(png_ptr, green_x, "cHRM Green X"),
       png_fixed(png_ptr, green_y, "cHRM Green Y"),
       png_fixed(png_ptr, blue_x, "cHRM Blue X"),
       png_fixed(png_ptr, blue_y, "cHRM Blue Y"));
}